

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
GetQueryParameterFromUri
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,char *uri,string *key)

{
  int iVar1;
  long lVar2;
  long lVar3;
  runtime_error *this;
  long *plVar4;
  long in_FS_OFFSET;
  evkeyvalq params_q;
  long local_38 [2];
  long local_28;
  
  plVar4 = local_38;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = evhttp_uri_parse(uri);
  if (lVar2 == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"URI parsing failed, it likely contained RFC 3986 invalid characters");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    lVar3 = evhttp_uri_get_query(lVar2);
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    if (lVar3 != 0) {
      evhttp_parse_query_str(lVar3,local_38);
      do {
        plVar4 = (long *)*plVar4;
        if (plVar4 == (long *)0x0) goto LAB_00477f71;
        iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(key,(char *)plVar4[2]);
      } while (iVar1 != 0);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)__return_storage_ptr__,(char **)(plVar4 + 3));
LAB_00477f71:
      evhttp_clear_headers(local_38);
    }
    evhttp_uri_free(lVar2);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> GetQueryParameterFromUri(const char* uri, const std::string& key)
{
    evhttp_uri* uri_parsed{evhttp_uri_parse(uri)};
    if (!uri_parsed) {
        throw std::runtime_error("URI parsing failed, it likely contained RFC 3986 invalid characters");
    }
    const char* query{evhttp_uri_get_query(uri_parsed)};
    std::optional<std::string> result;

    if (query) {
        // Parse the query string into a key-value queue and iterate over it
        struct evkeyvalq params_q;
        evhttp_parse_query_str(query, &params_q);

        for (struct evkeyval* param{params_q.tqh_first}; param != nullptr; param = param->next.tqe_next) {
            if (param->key == key) {
                result = param->value;
                break;
            }
        }
        evhttp_clear_headers(&params_q);
    }
    evhttp_uri_free(uri_parsed);

    return result;
}